

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<testing::internal::ExpectationBase> * __thiscall
testing::internal::linked_ptr<testing::internal::ExpectationBase>::operator=
          (linked_ptr<testing::internal::ExpectationBase> *this,
          linked_ptr<testing::internal::ExpectationBase> *ptr)

{
  if (ptr != this) {
    depart(this);
    copy<testing::internal::ExpectationBase>(this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }